

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O3

double SubsetCountMintermAux(DdNode *node,double max,st__table *table)

{
  NodeData_t *value;
  double *pdVar1;
  int iVar2;
  double **ppdVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  double **__ptr;
  long lVar8;
  NodeData_t **__ptr_00;
  ulong uVar9;
  double dVar10;
  double dVar11;
  NodeData_t *dummy;
  char *local_38;
  
  piVar7 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar7 == 0x7fffffff) {
    if (zero != node) {
      return max;
    }
    return 0.0;
  }
  iVar2 = st__lookup(table,(char *)node,&local_38);
  if (iVar2 != 0) {
    return **(double **)local_38;
  }
  uVar5 = *(ulong *)(piVar7 + 6);
  uVar9 = (ulong)((uint)node & 1);
  dVar10 = SubsetCountMintermAux((DdNode *)(*(ulong *)(piVar7 + 4) ^ uVar9),max,table);
  if (memOut != '\0') {
    return 0.0;
  }
  dVar11 = SubsetCountMintermAux((DdNode *)(uVar9 ^ uVar5),max,table);
  iVar2 = page;
  if (memOut != '\0') {
    return 0.0;
  }
  iVar4 = pageIndex;
  if (pageIndex == 0x800) {
    lVar8 = (long)page;
    uVar6 = page + 1;
    page = uVar6;
    ppdVar3 = mintermPages;
    if (uVar6 == maxPages) {
      ppdVar3 = (double **)malloc(lVar8 * 8 + 0x408);
      __ptr = mintermPages;
      if (ppdVar3 != (double **)0x0) {
        maxPages = iVar2 + 0x81;
        if (iVar2 < 0) {
          if (mintermPages == (double **)0x0) goto LAB_009224f1;
        }
        else {
          uVar5 = 0;
          do {
            ppdVar3[uVar5] = __ptr[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        free(__ptr);
        goto LAB_009224f1;
      }
      if (-1 < iVar2) {
        uVar5 = 0;
        do {
          if (__ptr[uVar5] != (double *)0x0) {
            free(__ptr[uVar5]);
            __ptr[uVar5] = (double *)0x0;
          }
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
        goto LAB_00922667;
      }
      if (mintermPages != (double **)0x0) goto LAB_00922667;
    }
    else {
LAB_009224f1:
      mintermPages = ppdVar3;
      __ptr = mintermPages;
      currentMintermPage = (double *)malloc(0x4000);
      __ptr[lVar8 + 1] = currentMintermPage;
      iVar4 = 0;
      if (currentMintermPage != (double *)0x0) goto LAB_00922517;
      if (-1 < iVar2) {
        uVar5 = 0;
        do {
          if (__ptr[uVar5] != (double *)0x0) {
            free(__ptr[uVar5]);
            __ptr[uVar5] = (double *)0x0;
          }
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
LAB_00922667:
      free(__ptr);
      mintermPages = (double **)0x0;
    }
    __ptr_00 = nodeDataPages;
    memOut = '\x01';
    uVar5 = (ulong)(uint)nodeDataPage;
    if (nodeDataPage < 0) {
LAB_0092270b:
      __ptr_00 = nodeDataPages;
      if (nodeDataPages == (NodeData_t **)0x0) goto LAB_0092273d;
    }
    else {
      lVar8 = 0;
      do {
        if (__ptr_00[lVar8] != (NodeData_t *)0x0) {
          free(__ptr_00[lVar8]);
          __ptr_00[lVar8] = (NodeData_t *)0x0;
        }
        lVar8 = lVar8 + 1;
      } while (uVar5 + 1 != lVar8);
    }
  }
  else {
LAB_00922517:
    pdVar1 = currentMintermPage;
    dVar10 = dVar11 * 0.5 + dVar10 * 0.5;
    pageIndex = iVar4 + 1;
    currentMintermPage[iVar4] = dVar10;
    if ((nodeDataPageIndex == 0x400) &&
       (ResizeNodeDataPages(), ppdVar3 = mintermPages, memOut == '\x01')) {
      uVar5 = (ulong)(uint)page;
      if (page < 0) {
        if (mintermPages == (double **)0x0) goto LAB_0092273d;
      }
      else {
        lVar8 = 0;
        do {
          if (ppdVar3[lVar8] != (double *)0x0) {
            free(ppdVar3[lVar8]);
            ppdVar3[lVar8] = (double *)0x0;
          }
          lVar8 = lVar8 + 1;
        } while (uVar5 + 1 != lVar8);
      }
      free(ppdVar3);
      mintermPages = (double **)0x0;
      goto LAB_0092273d;
    }
    value = currentNodeDataPage + nodeDataPageIndex;
    nodeDataPageIndex = nodeDataPageIndex + 1;
    value->mintermPointer = pdVar1 + iVar4;
    value->nodesPointer = (int *)0x0;
    iVar2 = st__insert(table,(char *)node,(char *)value);
    ppdVar3 = mintermPages;
    if (iVar2 != -10000) {
      return dVar10;
    }
    memOut = '\x01';
    uVar5 = (ulong)(uint)page;
    if (page < 0) {
      if (mintermPages != (double **)0x0) goto LAB_009226bf;
    }
    else {
      lVar8 = 0;
      do {
        if (ppdVar3[lVar8] != (double *)0x0) {
          free(ppdVar3[lVar8]);
          ppdVar3[lVar8] = (double *)0x0;
        }
        lVar8 = lVar8 + 1;
      } while (uVar5 + 1 != lVar8);
LAB_009226bf:
      free(ppdVar3);
      mintermPages = (double **)0x0;
    }
    __ptr_00 = nodeDataPages;
    uVar5 = (ulong)(uint)nodeDataPage;
    if (nodeDataPage < 0) goto LAB_0092270b;
    lVar8 = 0;
    do {
      if (__ptr_00[lVar8] != (NodeData_t *)0x0) {
        free(__ptr_00[lVar8]);
        __ptr_00[lVar8] = (NodeData_t *)0x0;
      }
      lVar8 = lVar8 + 1;
    } while (uVar5 + 1 != lVar8);
  }
  free(__ptr_00);
  nodeDataPages = (NodeData_t **)0x0;
LAB_0092273d:
  st__free_table(table);
  return 0.0;
}

Assistant:

static double
SubsetCountMintermAux(
  DdNode * node /* function to analyze */,
  double  max /* number of minterms of constant 1 */,
  st__table * table /* visitedTable table */)
{

    DdNode      *N,*Nv,*Nnv; /* nodes to store cofactors  */
    double      min,*pmin; /* minterm count */
    double      min1, min2; /* minterm count */
    NodeData_t *dummy;
    NodeData_t *newEntry;
    int i;

#ifdef DEBUG
    num_calls++;
#endif

    /* Constant case */
    if (Cudd_IsConstant(node)) {
        if (node == zero) {
            return(0.0);
        } else {
            return(max);
        }
    } else {

        /* check if entry for this node exists */
        if ( st__lookup(table, (const char *)node, (char **)&dummy)) {
            min = *(dummy->mintermPointer);
            return(min);
        }

        /* Make the node regular to extract cofactors */
        N = Cudd_Regular(node);

        /* store the cofactors */
        Nv = Cudd_T(N);
        Nnv = Cudd_E(N);

        Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
        Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

        min1 =  SubsetCountMintermAux(Nv, max,table)/2.0;
        if (memOut) return(0.0);
        min2 =  SubsetCountMintermAux(Nnv,max,table)/2.0;
        if (memOut) return(0.0);
        min = (min1+min2);

        /* if page index is at the bottom, then create a new page */
        if (pageIndex == pageSize) ResizeCountMintermPages();
        if (memOut) {
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }

        /* point to the correct location in the page */
        pmin = currentMintermPage+pageIndex;
        pageIndex++;

        /* store the minterm count of this node in the page */
        *pmin = min;

        /* Note I allocate the struct here. Freeing taken care of later */
        if (nodeDataPageIndex == nodeDataPageSize) ResizeNodeDataPages();
        if (memOut) {
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            st__free_table(table);
            return(0.0);
        }

        newEntry = currentNodeDataPage + nodeDataPageIndex;
        nodeDataPageIndex++;

        /* points to the correct location in the page */
        newEntry->mintermPointer = pmin;
        /* initialize this field of the Node Quality structure */
        newEntry->nodesPointer = NULL;

        /* insert entry for the node in the table */
        if ( st__insert(table,(char *)node, (char *)newEntry) == st__OUT_OF_MEM) {
            memOut = 1;
            for (i = 0; i <= page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            for (i = 0; i <= nodeDataPage; i++) ABC_FREE(nodeDataPages[i]);
            ABC_FREE(nodeDataPages);
            st__free_table(table);
            return(0.0);
        }
        return(min);
    }

}